

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

SoapySDRRange * SoapySDRDevice_getMasterClockRates(SoapySDRDevice *device,size_t *length)

{
  undefined1 *puVar1;
  SoapySDRRange *pSVar2;
  _Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> _Stack_28;
  
  *length = 0;
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_00141f38);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x230))(&_Stack_28,device);
  pSVar2 = toRangeList((RangeList *)&_Stack_28,length);
  std::_Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~_Vector_base(&_Stack_28);
  return pSVar2;
}

Assistant:

SoapySDRRange *SoapySDRDevice_getMasterClockRates(const SoapySDRDevice *device, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toRangeList(device->getMasterClockRates(), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}